

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

conversion_type crnlib::image_utils::get_image_conversion_type_from_crn_format(crn_format fmt)

{
  crn_format fmt_local;
  
  switch(fmt) {
  case cCRNFmtDXT5_CCxY:
    fmt_local._4_4_ = cCRNFmtDXT1 >> 0x20;
    break;
  case cCRNFmtDXT5_xGxR:
    fmt_local._4_4_ = 2;
    break;
  case cCRNFmtDXT5_xGBR:
    fmt_local._4_4_ = 4;
    break;
  case cCRNFmtDXT5_AGBR:
    fmt_local._4_4_ = 6;
    break;
  default:
    fmt_local._4_4_ = ~cCRNFmtForceDWORD >> 0x20;
  }
  return fmt_local._4_4_;
}

Assistant:

image_utils::conversion_type get_image_conversion_type_from_crn_format(crn_format fmt)
        {
            switch (fmt)
            {
            case cCRNFmtDXT5_CCxY:
                return image_utils::cConversion_To_CCxY;
            case cCRNFmtDXT5_xGxR:
                return image_utils::cConversion_To_xGxR;
            case cCRNFmtDXT5_xGBR:
                return image_utils::cConversion_To_xGBR;
            case cCRNFmtDXT5_AGBR:
                return image_utils::cConversion_To_AGBR;
            default:
                break;
            }
            return image_utils::cConversion_Invalid;
        }